

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O1

void cast_protection(void)

{
  boolean bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  
  uVar2 = (uint)u.uspellprot;
  iVar6 = 0;
  iVar3 = u.ulevel;
  if (u.ulevel != 0) {
    do {
      iVar6 = iVar6 + 1;
      uVar5 = iVar3 + 1;
      iVar3 = iVar3 / 2;
    } while (2 < uVar5);
  }
  uVar8 = 1;
  if ((int)(uVar2 - (int)u.uac) < 0x1e) {
    iVar3 = (int)((ulong)((long)(int)((uVar2 - (int)u.uac) + 10) * -0x66666667) >> 0x20);
    uVar8 = (ulong)(((iVar3 >> 2) - (iVar3 >> 0x1f)) + 4);
  }
  iVar3 = (int)(uVar2 / uVar8);
  iVar7 = iVar6 - iVar3;
  if (iVar7 != 0 && iVar3 <= iVar6) {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar4 = hcolor("golden");
      if (u.uspellprot == '\0') {
        pcVar9 = "water";
        if (((u._1052_1_ & 2) == 0) &&
           (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
          if ((u._1052_1_ & 1) == 0) {
            pcVar9 = "air";
            if (level->locations[u.ux][u.uy].typ < '\r') {
              pcVar9 = "stone";
            }
          }
          else {
            pcVar9 = mbodypart(u.ustuck,0x12);
          }
        }
        pcVar4 = an(pcVar4);
        pline("The %s around you begins to shimmer with %s haze.",pcVar9,pcVar4);
      }
      else {
        pline("The %s haze around you becomes more dense.",pcVar4);
      }
    }
    u.uspellprot = u.uspellprot + (char)iVar7;
    u.uspmtime = '\n';
    if (u.weapon_skills[objects[0x1a2].oc_subtyp].skill == '\x04') {
      u.uspmtime = '\x14';
    }
    if (u.usptime == '\0') {
      u.usptime = u.uspmtime;
    }
    find_ac();
    return;
  }
  pline("Your skin feels warm for a moment.",uVar8,(ulong)uVar2 % uVar8);
  return;
}

Assistant:

static void cast_protection(void)
{
	int loglev = 0;
	int l = u.ulevel;
	int natac = u.uac - u.uspellprot;
	int gain;

	/* loglev=log2(u.ulevel)+1 (1..5) */
	while (l) {
	    loglev++;
	    l /= 2;
	}

	/* The more u.uspellprot you already have, the less you get,
	 * and the better your natural ac, the less you get.
	 *
	 *	LEVEL AC    SPELLPROT from sucessive SPE_PROTECTION casts
	 *      1     10    0,  1,  2,  3,  4
	 *      1      0    0,  1,  2,  3
	 *      1    -10    0,  1,  2
	 *      2-3   10    0,  2,  4,  5,  6,  7,  8
	 *      2-3    0    0,  2,  4,  5,  6
	 *      2-3  -10    0,  2,  3,  4
	 *      4-7   10    0,  3,  6,  8,  9, 10, 11, 12
	 *      4-7    0    0,  3,  5,  7,  8,  9
	 *      4-7  -10    0,  3,  5,  6
	 *      7-15 -10    0,  3,  5,  6
	 *      8-15  10    0,  4,  7, 10, 12, 13, 14, 15, 16
	 *      8-15   0    0,  4,  7,  9, 10, 11, 12
	 *      8-15 -10    0,  4,  6,  7,  8
	 *     16-30  10    0,  5,  9, 12, 14, 16, 17, 18, 19, 20
	 *     16-30   0    0,  5,  9, 11, 13, 14, 15
	 *     16-30 -10    0,  5,  8,  9, 10
	 */
	gain = loglev - (int)u.uspellprot / (4 - min(3,(10 - natac)/10));

	if (gain > 0) {
	    if (!Blind) {
		const char *hgolden = hcolor("golden");

		if (u.uspellprot)
		    pline("The %s haze around you becomes more dense.",
			      hgolden);
		else
		    pline("The %s around you begins to shimmer with %s haze.",
			(Underwater || Is_waterlevel(&u.uz)) ? "water" :
			 u.uswallow ? mbodypart(u.ustuck, STOMACH) :
			 IS_STWALL(level->locations[u.ux][u.uy].typ) ? "stone" : "air",
			      an(hgolden));
	    }
	    u.uspellprot += gain;
	    u.uspmtime =
		P_SKILL(spell_skilltype(SPE_PROTECTION)) == P_EXPERT ? 20 : 10;
	    if (!u.usptime)
		u.usptime = u.uspmtime;
	    find_ac();
	} else {
	    pline("Your skin feels warm for a moment.");
	}
}